

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void generate_luma_grain_block
               (aom_film_grain_t *params,int **pred_pos_luma,int *luma_grain_block,
               int luma_block_size_y,int luma_block_size_x,int luma_grain_stride,int left_pad,
               int top_pad,int right_pad,int bottom_pad)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  byte bVar5;
  int in_ECX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int pos;
  int wsum;
  int j_1;
  int i_1;
  int j;
  int i;
  int rounding_offset;
  int num_pos_luma;
  int gauss_sec_shift;
  int bit_depth;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  
  if (*(int *)(in_RDI + 0x78) == 0) {
    memset(in_RDX,0,(long)in_ECX * 4 * (long)in_R9D);
  }
  else {
    bVar5 = ('\f' - (char)*(undefined4 *)(in_RDI + 0x278)) + (char)*(undefined4 *)(in_RDI + 0x280);
    iVar1 = *(int *)(in_RDI + 0x128);
    iVar2 = *(int *)(in_RDI + 0x128);
    uVar3 = *(undefined4 *)(in_RDI + 0x254);
    for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
      for (local_3c = 0; local_3c < in_R8D; local_3c = local_3c + 1) {
        iVar4 = get_random_number(0xb);
        *(int *)((long)in_RDX + (long)(local_38 * in_R9D + local_3c) * 4) =
             gaussian_sequence[iVar4] + ((1 << (bVar5 & 0x1f)) >> 1) >> (bVar5 & 0x1f);
      }
    }
    for (local_40 = wsum; local_40 < in_ECX - i; local_40 = local_40 + 1) {
      for (local_44 = in_stack_00000008; local_44 < in_R8D - i_1; local_44 = local_44 + 1) {
        local_48 = 0;
        for (local_4c = 0; local_4c < iVar1 * 2 * (iVar2 + 1); local_4c = local_4c + 1) {
          local_48 = local_48 +
                     *(int *)(in_RDI + 300 + (long)local_4c * 4) *
                     *(int *)((long)in_RDX +
                             (long)((local_40 + **(int **)(in_RSI + (long)local_4c * 8)) * in_R9D +
                                    local_44 + *(int *)(*(long *)(in_RSI + (long)local_4c * 8) + 4))
                             * 4);
        }
        iVar4 = clamp(*(int *)((long)in_RDX + (long)(local_40 * in_R9D + local_44) * 4) +
                      (local_48 + (1 << ((char)uVar3 - 1U & 0x1f)) >>
                      ((byte)*(undefined4 *)(in_RDI + 0x254) & 0x1f)),grain_min,grain_max);
        *(int *)((long)in_RDX + (long)(local_40 * in_R9D + local_44) * 4) = iVar4;
      }
    }
  }
  return;
}

Assistant:

static void generate_luma_grain_block(
    const aom_film_grain_t *params, int **pred_pos_luma, int *luma_grain_block,
    int luma_block_size_y, int luma_block_size_x, int luma_grain_stride,
    int left_pad, int top_pad, int right_pad, int bottom_pad) {
  if (params->num_y_points == 0) {
    memset(luma_grain_block, 0,
           sizeof(*luma_grain_block) * luma_block_size_y * luma_grain_stride);
    return;
  }

  int bit_depth = params->bit_depth;
  int gauss_sec_shift = 12 - bit_depth + params->grain_scale_shift;

  int num_pos_luma = 2 * params->ar_coeff_lag * (params->ar_coeff_lag + 1);
  int rounding_offset = (1 << (params->ar_coeff_shift - 1));

  for (int i = 0; i < luma_block_size_y; i++)
    for (int j = 0; j < luma_block_size_x; j++)
      luma_grain_block[i * luma_grain_stride + j] =
          (gaussian_sequence[get_random_number(gauss_bits)] +
           ((1 << gauss_sec_shift) >> 1)) >>
          gauss_sec_shift;

  for (int i = top_pad; i < luma_block_size_y - bottom_pad; i++)
    for (int j = left_pad; j < luma_block_size_x - right_pad; j++) {
      int wsum = 0;
      for (int pos = 0; pos < num_pos_luma; pos++) {
        wsum = wsum + params->ar_coeffs_y[pos] *
                          luma_grain_block[(i + pred_pos_luma[pos][0]) *
                                               luma_grain_stride +
                                           j + pred_pos_luma[pos][1]];
      }
      luma_grain_block[i * luma_grain_stride + j] =
          clamp(luma_grain_block[i * luma_grain_stride + j] +
                    ((wsum + rounding_offset) >> params->ar_coeff_shift),
                grain_min, grain_max);
    }
}